

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::trainThread(FastText *this,int32_t threadId,TrainCallback *callback)

{
  bool bVar1;
  undefined4 uVar2;
  element_type *peVar3;
  vector<int,_std::allocator<int>_> *words;
  istream *in;
  FastText *this_00;
  element_type *this_01;
  vector<int,_std::allocator<int>_> *pvVar4;
  __int_type_conflict _Var5;
  ulong uVar6;
  ulong uVar7;
  State *in_RDX;
  real in_ESI;
  long in_RDI;
  float fVar8;
  float fVar9;
  EncounteredNaNError *anon_var_0;
  real lr;
  int64_t eta;
  double lr_1;
  double wst;
  real progress;
  uint64_t callbackCounter;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  int64_t localTokenCount;
  int64_t ntokens;
  State state;
  ifstream ifs;
  undefined4 in_stack_fffffffffffffc38;
  real in_stack_fffffffffffffc3c;
  State *in_stack_fffffffffffffc40;
  int32_t in_stack_fffffffffffffc48;
  int32_t in_stack_fffffffffffffc4c;
  int32_t in_stack_fffffffffffffc50;
  real in_stack_fffffffffffffc54;
  float in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  function<void_(float,_float,_double,_double,_long)> *in_stack_fffffffffffffc60;
  State *in_stack_fffffffffffffc68;
  float in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  vector<int,_std::allocator<int>_> *line_00;
  real lr_00;
  int iVar10;
  FastText *this_02;
  Dictionary *in_stack_fffffffffffffcc0;
  istream *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce4;
  State *in_stack_fffffffffffffce8;
  FastText *in_stack_fffffffffffffcf0;
  ulong local_2d8;
  State *local_2a0;
  State local_290;
  FastText local_220 [4];
  State *local_18;
  real local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b8330);
  this_02 = local_220;
  std::ifstream::ifstream(this_02,(string *)&peVar3->input,_S_in);
  words = (vector<int,_std::allocator<int>_> *)(long)(int)local_c;
  in = (istream *)utils::size((ifstream *)in_stack_fffffffffffffc40);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b838f);
  utils::seek((ifstream *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
              CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b83bf);
  iVar10 = peVar3->dim;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b83d7);
  this_00 = (FastText *)
            Matrix::size((Matrix *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                         (int64_t)in_stack_fffffffffffffc40);
  uVar2 = SUB84(this_00,0);
  lr_00 = local_c;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b8408);
  Model::State::State((State *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                      (int32_t)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                      (int32_t)in_stack_fffffffffffffc68,
                      (int32_t)((ulong)in_stack_fffffffffffffc60 >> 0x20));
  this_01 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b8439);
  pvVar4 = (vector<int,_std::allocator<int>_> *)Dictionary::ntokens(this_01);
  local_2a0 = (State *)0x0;
  line_00 = pvVar4;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b846e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b847b);
  local_2d8 = 0;
  while (bVar1 = keepTraining((FastText *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)), bVar1)
  {
    _Var5 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    fVar8 = (float)_Var5;
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b84c5);
    fVar9 = fVar8 / (float)((long)peVar3->epoch * (long)pvVar4);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(float,_float,_double,_double,_long)> *)
                       in_stack_fffffffffffffc40);
    if ((bVar1) && (uVar7 = local_2d8 + 1, uVar6 = local_2d8 & 0x3f, local_2d8 = uVar7, uVar6 == 0))
    {
      progressInfo(this_02,(real)((ulong)in_RDI >> 0x20));
      in_stack_fffffffffffffc60 =
           (function<void_(float,_float,_double,_double,_long)> *)&stack0xfffffffffffffcd8;
      std::tie<double,double,long>
                ((double *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                 (double *)in_stack_fffffffffffffc40,
                 (long *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      std::tuple<double&,double&,long&>::operator=
                ((tuple<double_&,_double_&,_long_&> *)in_stack_fffffffffffffc40,
                 (tuple<long,_double,_double> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      in_stack_fffffffffffffc68 = local_18;
      in_stack_fffffffffffffc70 = fVar9;
      std::atomic::operator_cast_to_float((atomic<float> *)0x1b85ab);
      std::function<void_(float,_float,_double,_double,_long)>::operator()
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58,
                 (double)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (double)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                 (long)in_stack_fffffffffffffc40);
    }
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b86cd);
    fVar9 = (float)(peVar3->lr * (1.0 - (double)fVar9));
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8706);
    if (peVar3->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b8721);
      in_stack_fffffffffffffc50 =
           Dictionary::getLine((Dictionary *)CONCAT44(fVar9,in_stack_fffffffffffffcd0),
                               in_stack_fffffffffffffcc8,
                               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0,
                               (vector<int,_std::allocator<int>_> *)in);
      local_2a0 = (State *)((long)&((_Function_base *)&local_2a0->lossValue_)->_M_functor +
                           (long)in_stack_fffffffffffffc50);
      supervised((FastText *)CONCAT44(fVar8,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68,
                 (real)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    }
    else {
      peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b879d);
      if (peVar3->model == cbow) {
        std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b87b4);
        in_stack_fffffffffffffc4c =
             Dictionary::getLine(in_stack_fffffffffffffcc0,in,words,(minstd_rand *)this_02);
        local_2a0 = (State *)((long)&((_Function_base *)&local_2a0->lossValue_)->_M_functor +
                             (long)in_stack_fffffffffffffc4c);
        cbow(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,(real)in_stack_fffffffffffffce4,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd8);
      }
      else {
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b8828);
        if (peVar3->model == sg) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b883f);
          in_stack_fffffffffffffc48 =
               Dictionary::getLine(in_stack_fffffffffffffcc0,in,words,(minstd_rand *)this_02);
          local_2a0 = (State *)((long)&((_Function_base *)&local_2a0->lossValue_)->_M_functor +
                               (long)in_stack_fffffffffffffc48);
          skipgram(this_00,(State *)CONCAT44(iVar10,uVar2),lr_00,line_00);
        }
      }
    }
    in_stack_fffffffffffffc40 = local_2a0;
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b88c1);
    if ((long)peVar3->lrUpdateRate < (long)in_stack_fffffffffffffc40) {
      std::__atomic_base<long>::operator+=
                ((__atomic_base<long> *)(in_RDI + 0x50),(__int_type_conflict)local_2a0);
      local_2a0 = (State *)0x0;
      if ((local_c == 0.0) &&
         (peVar3 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b890b), 1 < peVar3->verbose)) {
        in_stack_fffffffffffffc3c = Model::State::getLoss(&local_290);
        std::atomic<float>::operator=
                  ((atomic<float> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      }
    }
  }
  if (local_c == 0.0) {
    in_stack_fffffffffffffc54 = Model::State::getLoss(&local_290);
    std::atomic<float>::operator=
              ((atomic<float> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  }
  std::ifstream::close();
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  Model::State::~State(in_stack_fffffffffffffc40);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId, const TrainCallback& callback) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId + args_->seed);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  uint64_t callbackCounter = 0;
  try {
    while (keepTraining(ntokens)) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      if (callback && ((callbackCounter++ % 64) == 0)) {
        double wst;
        double lr;
        int64_t eta;
        std::tie<double, double, int64_t>(wst, lr, eta) =
            progressInfo(progress);
        callback(progress, loss_, wst, lr, eta);
      }
      real lr = args_->lr * (1.0 - progress);
      if (args_->model == model_name::sup) {
        localTokenCount += dict_->getLine(ifs, line, labels);
        supervised(state, lr, line, labels);
      } else if (args_->model == model_name::cbow) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        cbow(state, lr, line);
      } else if (args_->model == model_name::sg) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        skipgram(state, lr, line);
      }
      if (localTokenCount > args_->lrUpdateRate) {
        tokenCount_ += localTokenCount;
        localTokenCount = 0;
        if (threadId == 0 && args_->verbose > 1) {
          loss_ = state.getLoss();
        }
      }
    }
  } catch (DenseMatrix::EncounteredNaNError&) {
    trainException_ = std::current_exception();
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}